

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O0

void __thiscall
FGLRenderer::WriteSavePic(FGLRenderer *this,player_t *player,FILE *file,int width,int height)

{
  bool bVar1;
  ADynamicLight *pAVar2;
  AActor *camera;
  sector_t *viewsector_00;
  void *block;
  byte *scr;
  sector_t *viewsector;
  TThinkerIterator<ADynamicLight> it;
  GL_IRECT bounds;
  int height_local;
  int width_local;
  FILE *file_local;
  player_t *player_local;
  FGLRenderer *this_local;
  
  it.super_FThinkerIterator.m_Stat = '\0';
  it.super_FThinkerIterator.m_SearchStats = false;
  it.super_FThinkerIterator.m_SearchingFresh = false;
  it.super_FThinkerIterator._19_1_ = 0;
  it.super_FThinkerIterator._20_4_ = 0;
  (*_ptrc_glFlush)();
  SetFixedColormap(this,player);
  FRenderState::SetVertexBuffer(&gl_RenderState,&this->mVBO->super_FVertexBuffer);
  FFlatVertexBuffer::Reset(GLRenderer->mVBO);
  if ((gl.legacyMode & 1U) == 0) {
    FLightBuffer::Clear(GLRenderer->mLights);
  }
  TThinkerIterator<ADynamicLight>::TThinkerIterator
            ((TThinkerIterator<ADynamicLight> *)&viewsector,0x40);
  pAVar2 = TThinkerIterator<ADynamicLight>::Next((TThinkerIterator<ADynamicLight> *)&viewsector);
  GLRenderer->mLightCount = (uint)(pAVar2 != (ADynamicLight *)0x0);
  camera = ::TObjPtr::operator_cast_to_AActor_
                     ((TObjPtr *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0));
  viewsector_00 =
       RenderViewpoint(this,camera,(GL_IRECT *)&it.super_FThinkerIterator.m_Stat,
                       (float)FieldOfView.Degrees,1.6,1.6,true,false);
  (*_ptrc_glDisable)(0xb90);
  FRenderState::SetFixedColormap(&gl_RenderState,0);
  FRenderState::SetSoftLightLevel(&gl_RenderState,-1);
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])(screen,0);
  bVar1 = FGLRenderBuffers::IsEnabled();
  if (!bVar1) {
    DrawBlend(this,viewsector_00);
  }
  CopyToBackbuffer(this,(GL_IRECT *)&it.super_FThinkerIterator.m_Stat,false);
  (*_ptrc_glFlush)();
  block = M_Malloc_Dbg((long)(width * height * 3),
                       "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/gl/scene/gl_scene.cpp"
                       ,0x3da);
  (*_ptrc_glReadPixels)(0,0,width,height,0x1907,0x1401,block);
  M_CreatePNG(file,(BYTE *)((long)block + (long)((height + -1) * width * 3)),(PalEntry *)0x0,SS_RGB,
              width,height,width * -3);
  M_Free(block);
  return;
}

Assistant:

void FGLRenderer::WriteSavePic (player_t *player, FILE *file, int width, int height)
{
	GL_IRECT bounds;

	bounds.left=0;
	bounds.top=0;
	bounds.width=width;
	bounds.height=height;
	glFlush();
	SetFixedColormap(player);
	gl_RenderState.SetVertexBuffer(mVBO);
	GLRenderer->mVBO->Reset();
	if (!gl.legacyMode) GLRenderer->mLights->Clear();

	// Check if there's some lights. If not some code can be skipped.
	TThinkerIterator<ADynamicLight> it(STAT_DLIGHT);
	GLRenderer->mLightCount = ((it.Next()) != NULL);

	sector_t *viewsector = RenderViewpoint(players[consoleplayer].camera, &bounds, 
								FieldOfView.Degrees, 1.6f, 1.6f, true, false);
	glDisable(GL_STENCIL_TEST);
	gl_RenderState.SetFixedColormap(CM_DEFAULT);
	gl_RenderState.SetSoftLightLevel(-1);
	screen->Begin2D(false);
	if (!FGLRenderBuffers::IsEnabled())
	{
		DrawBlend(viewsector);
	}
	CopyToBackbuffer(&bounds, false);
	glFlush();

	byte * scr = (byte *)M_Malloc(width * height * 3);
	glReadPixels(0,0,width, height,GL_RGB,GL_UNSIGNED_BYTE,scr);
	M_CreatePNG (file, scr + ((height-1) * width * 3), NULL, SS_RGB, width, height, -width*3);
	M_Free(scr);
}